

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_validity_cb(lws_sorted_usec_list_t *sul)

{
  char cVar1;
  lws_dll2 *plVar2;
  long lVar3;
  lws_dll2 **wsi_00;
  lws_log_cx *plVar4;
  lws_usec_t lVar5;
  lws_retry_bo_t *rbo;
  lws_context_per_thread *pt;
  lws *wsi;
  lws_sorted_usec_list_t *sul_local;
  
  wsi_00 = &sul[-10].list.next;
  plVar2 = *wsi_00;
  cVar1 = *(char *)((long)&sul[0xe].list.next + 5);
  lVar3 = sul[8].us;
  if ((*(ulong *)((long)&sul[0xd].cb + 6) >> 0x28 & 1) == 0) {
    plVar4 = lwsl_wsi_get_cx((lws *)wsi_00);
    _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi_00,8,"lws_validity_cb","scheduling validity check");
    if (((ulong)sul[8].list.next[1].next & 0xf00) != 0) {
      (*(code *)(&(sul[8].list.next)->owner->tail)
                [(int)((*(byte *)((long)&sul[8].list.next[1].next + 1) & 0xf) - 1)])(wsi_00,0);
    }
    if (*(ushort *)(lVar3 + 0xe) <= *(ushort *)(lVar3 + 0xc)) {
      __assert_fail("rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi-timeout.c"
                    ,0x13a,"void lws_validity_cb(lws_sorted_usec_list_t *)");
    }
    *(ulong *)((long)&sul[0xd].cb + 6) =
         *(ulong *)((long)&sul[0xd].cb + 6) & 0xfffffeffffffffff | 0x10000000000;
    lVar5 = lws_now_usecs();
    sul->us = lVar5 + ((ulong)*(ushort *)(lVar3 + 0xe) - (ulong)*(ushort *)(lVar3 + 0xc)) * 1000000;
    __lws_sul_insert((lws_dll2_owner_t *)
                     ((long)plVar2 +
                     (long)(int)(uint)((*(ulong *)((long)&sul[0xd].cb + 6) >> 0x2b & 1) != 0) * 0x18
                     + (long)(int)cVar1 * 0x1a0 + 0x2c8),sul);
  }
  else {
    plVar4 = lwsl_wsi_get_cx((lws *)wsi_00);
    _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi_00,8,"lws_validity_cb","validity too old");
    __lws_close_free_wsi((lws *)wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"validity timeout");
  }
  return;
}

Assistant:

static void
lws_validity_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_validity);
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	const lws_retry_bo_t *rbo = wsi->retry_policy;

	/* one of either the ping or hangup validity threshold was crossed */

	if (wsi->validity_hup) {
		lwsl_wsi_info(wsi, "validity too old");
		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				     "validity timeout");
		return;
	}

	/* schedule a protocol-dependent ping */

	lwsl_wsi_info(wsi, "scheduling validity check");

	if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_issue_keepalive))
		lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_issue_keepalive).
							issue_keepalive(wsi, 0);

	/*
	 * We arrange to come back here after the additional ping to hangup time
	 * and do the hangup, unless we get validated (by, eg, a PONG) and
	 * reset the timer
	 */

	assert(rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping);

	wsi->validity_hup = 1;
	__lws_sul_insert_us(&pt->pt_sul_owner[!!wsi->conn_validity_wakesuspend],
			    &wsi->sul_validity,
			    ((uint64_t)rbo->secs_since_valid_hangup -
				 rbo->secs_since_valid_ping) * LWS_US_PER_SEC);
}